

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1604.cpp
# Opt level: O3

int main(void)

{
  uint uVar1;
  ulong uVar2;
  ostream *poVar3;
  int t;
  int *piVar4;
  int iVar5;
  long lVar6;
  bool bVar7;
  int n;
  pair<int,_int> p [10000];
  uint auStack_138b0 [2];
  pair<int,_int> pStack_138a8;
  pair<int,_int> pStack_138a0;
  int aiStack_13898 [19998];
  
  iVar5 = 0;
  memset(&pStack_138a8,0,80000);
  std::istream::operator>>((istream *)&std::cin,(int *)(auStack_138b0 + 1));
  if (0 < (int)auStack_138b0[1]) {
    lVar6 = 0;
    piVar4 = &pStack_138a8.second;
    iVar5 = 0;
    do {
      std::istream::operator>>((istream *)&std::cin,piVar4);
      iVar5 = iVar5 + *piVar4;
      lVar6 = lVar6 + 1;
      ((pair<int,_int> *)(piVar4 + -1))->first = (int)lVar6;
      piVar4 = piVar4 + 2;
    } while (lVar6 < (int)auStack_138b0[1]);
  }
  if (auStack_138b0[1] != 0) {
    uVar2 = (ulong)(int)auStack_138b0[1];
    lVar6 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::
    __introsort_loop<std::pair<int,int>*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<int,int>,std::pair<int,int>)>>
              (&pStack_138a8,&pStack_138a0 + (uVar2 - 1),(ulong)(((uint)lVar6 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(std::pair<int,_int>,_std::pair<int,_int>)>)0x1011bc);
    std::
    __final_insertion_sort<std::pair<int,int>*,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<int,int>,std::pair<int,int>)>>
              (&pStack_138a8,&pStack_138a0 + (uVar2 - 1),
               (_Iter_comp_iter<bool_(*)(std::pair<int,_int>,_std::pair<int,_int>)>)0x1011bc);
  }
  do {
    bVar7 = iVar5 == 0;
    iVar5 = iVar5 + -1;
    if (bVar7) {
      return 0;
    }
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,pStack_138a8.first);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    pStack_138a8.second = pStack_138a8.second + -1;
    if (pStack_138a0.second != 0) {
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,pStack_138a0.first);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      pStack_138a0.second = pStack_138a0.second + -1;
    }
    uVar2 = 2;
    do {
      uVar1 = auStack_138b0[uVar2 * 2 + 1];
      if ((&pStack_138a0)[uVar2 - 1].second <= (int)uVar1) break;
      auStack_138b0[uVar2 * 2 + 1] = (&pStack_138a0)[uVar2 - 1].second;
      (&pStack_138a0)[uVar2 - 1].second = uVar1;
      uVar1 = auStack_138b0[uVar2 * 2];
      auStack_138b0[uVar2 * 2] = (&pStack_138a0)[uVar2 - 1].first;
      (&pStack_138a0)[uVar2 - 1].first = uVar1;
      uVar2 = uVar2 + 1;
    } while (auStack_138b0[1] != uVar2);
    uVar2 = 1;
    do {
      uVar1 = auStack_138b0[uVar2 * 2 + 1];
      if ((&pStack_138a0)[uVar2 - 1].second <= (int)uVar1) break;
      auStack_138b0[uVar2 * 2 + 1] = (&pStack_138a0)[uVar2 - 1].second;
      (&pStack_138a0)[uVar2 - 1].second = uVar1;
      uVar1 = auStack_138b0[uVar2 * 2];
      auStack_138b0[uVar2 * 2] = (&pStack_138a0)[uVar2 - 1].first;
      (&pStack_138a0)[uVar2 - 1].first = uVar1;
      uVar2 = uVar2 + 1;
    } while (auStack_138b0[1] != uVar2);
    if (pStack_138a8.second < 1) {
      return 0;
    }
  } while( true );
}

Assistant:

int main() {
    std::pair<int, int> p[10000];
    int n;
    std::cin >> n;
    int sum = 0;
    for (int i = 0; i < n; ++i) {
        std::cin >> p[i].second;
        sum += p[i].second;
        p[i].first = i + 1;
    }
    sort(p, p + n, comp);
    while (sum--) {
        std::cout << p[0].first << " ";
        p[0].second--;
        if (p[1].second != 0) {
            std::cout << p[1].first << " ";
            p[1].second--;
        }
        int j = 1, k = 2;
        while (p[j].second < p[k].second) {
            int t = p[j].second;
            p[j].second = p[k].second;
            p[k].second = t;
            t = p[j].first;
            p[j].first = p[k].first;
            p[k].first = t;
            k++;
            j++;
            if (k == n) {
                break;
            }
        }
        j = 0, k = 1;
        while (p[j].second < p[k].second) {
            int t = p[j].second;
            p[j].second = p[k].second;
            p[k].second = t;
            t = p[j].first;
            p[j].first = p[k].first;
            p[k].first = t;
            k++;
            j++;
            if (k == n) {
                break;
            }
        }
        if (p[0].second <= 0) {
            return 0;
        }
    }
    return 0;
}